

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O0

int __thiscall
bdConnection::ConnectionSetup
          (bdConnection *this,bdId *proxyId,bdId *srcConnAddr,bdId *destId,int mode,int delay)

{
  time_t tVar1;
  int delay_local;
  int mode_local;
  bdId *destId_local;
  bdId *srcConnAddr_local;
  bdId *proxyId_local;
  bdConnection *this_local;
  
  this->mState = 3;
  tVar1 = time((time_t *)0x0);
  this->mLastEvent = tVar1;
  memcpy(&this->mSrcId,srcConnAddr,0x24);
  memcpy(&this->mDestId,destId,0x24);
  memcpy(&this->mProxyId,proxyId,0x24);
  this->mPoint = 1;
  this->mMode = mode;
  memcpy(&this->mSrcConnAddr,srcConnAddr,0x24);
  memcpy(&this->mDestConnAddr,destId,0x24);
  this->mBandwidth = 0;
  this->mMaxDelay = delay;
  tVar1 = time((time_t *)0x0);
  this->mConnectionStartTS = tVar1;
  bdsockaddr_clear(&(this->mSrcId).addr);
  bdsockaddr_clear(&(this->mDestId).addr);
  bdsockaddr_clear(&(this->mDestConnAddr).addr);
  return 1;
}

Assistant:

int bdConnection::ConnectionSetup(bdId *proxyId, bdId *srcConnAddr, bdId *destId, int mode, int delay) {
	mState = BITDHT_CONNECTION_WAITING_START; /* or REPLY, no AUTH required */
	mLastEvent = time(NULL);
	mSrcId = *srcConnAddr;    /* self, IP unknown */
	mDestId = *destId;  /* dest, IP unknown */
	mProxyId =  *proxyId;  /* full proxy/dest address */

	mPoint = BD_PROXY_CONNECTION_START_POINT;
	mMode = mode;

	mSrcConnAddr = *srcConnAddr; /* self, full ID/IP */
	mDestConnAddr = *destId; /* IP unknown */

	mBandwidth = 0;
	mMaxDelay = delay;
	mConnectionStartTS = time(NULL);

#ifdef DEBUG_CONNECTION_DELAY
	std::cerr << "bdConnection::ConnectionSetup(): delay: " << mMaxDelay;
	std::cerr << std::endl;
#endif

	/* clear IP Addresses to enforce this */
	bdsockaddr_clear(&(mSrcId.addr)); 
	bdsockaddr_clear(&(mDestId.addr)); 
	bdsockaddr_clear(&(mDestConnAddr.addr)); 

	/* don't bother with START/ACK parameters */
	return 1;
}